

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

double __thiscall
BayesianGameForDecPOMDPStage::ComputeImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI)

{
  const_reference ppJVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double p;
  Index s;
  BeliefIteratorGeneric bit;
  double r;
  JointBeliefInterface *jb;
  Index in_stack_ffffffffffffff78;
  Index in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 local_30 [16];
  double local_20;
  value_type local_18;
  
  ppJVar1 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                      ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_18 = *ppJVar1;
  local_20 = 0.0;
  if (local_18 != (value_type)0x0) {
    (**(code **)(*(long *)((long)&local_18->field_0x0 + *(long *)((long)*local_18 + -0xb8)) + 0x98))
              (local_30,(long)&local_18->field_0x0 + *(long *)((long)*local_18 + -0xb8));
    do {
      BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8b7482);
      dVar2 = BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8b749a);
      auVar3._0_8_ = PlanningUnitDecPOMDPDiscrete::GetReward
                               ((PlanningUnitDecPOMDPDiscrete *)
                                CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar2;
      auVar3._8_8_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_20;
      auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
      local_20 = auVar3._0_8_;
      in_stack_ffffffffffffff87 = BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8b7502);
    } while ((bool)in_stack_ffffffffffffff87);
    BeliefIteratorGeneric::~BeliefIteratorGeneric
              ((BeliefIteratorGeneric *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  }
  return local_20;
}

Assistant:

double BayesianGameForDecPOMDPStage::
ComputeImmediateReward(Index jtI, Index jaI) const
{
    //Index jaohI = _m_jaohReps.at(jtI);
    JointBeliefInterface* jb = _m_JBs.at(jtI);
    double r = 0.0;
    if(jb)
    {    
        BeliefIteratorGeneric bit = jb->GetIterator();
        do{
            Index s = bit.GetStateIndex();
            double p = bit.GetProbability();
            r += p * _m_pu->GetReward(s, jaI);
        }while (bit.Next() );
    }
    return r;
    
}